

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort.cpp
# Opt level: O2

TrieNode<unsigned_short> * __thiscall
BurstSimple<unsigned_short>::operator()
          (BurstSimple<unsigned_short> *this,vector_brodnik<unsigned_char_*> *bucket,size_t depth)

{
  ushort uVar1;
  uint16_t uVar2;
  TrieNode<unsigned_short> *this_00;
  size_t sVar3;
  uchar *ptr;
  vector_brodnik<unsigned_char_*> *pvVar4;
  ulong index;
  uchar **t;
  uint j;
  long lVar5;
  array<unsigned_short,_64UL> cache;
  array<unsigned_char_*,_64UL> strings;
  
  this_00 = (TrieNode<unsigned_short> *)operator_new(0x82000);
  TrieNode<unsigned_short>::TrieNode(this_00);
  sVar3 = vector_brodnik<unsigned_char_*>::size(bucket);
  for (index = 0; index < ((uint)sVar3 & 0xffffffc0); index = index + 0x40) {
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      ptr = vector_brodnik<unsigned_char_*>::operator[](bucket,index + lVar5);
      strings._M_elems[lVar5] = ptr;
      uVar2 = get_char<unsigned_short>(ptr,depth);
      cache._M_elems[lVar5] = uVar2;
    }
    t = strings._M_elems;
    for (lVar5 = 0; lVar5 != 0x40; lVar5 = lVar5 + 1) {
      uVar1 = cache._M_elems[lVar5];
      pvVar4 = (vector_brodnik<unsigned_char_*> *)(this_00->buckets)._M_elems[uVar1];
      if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
        pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
        vector_brodnik<unsigned_char_*>::vector_brodnik(pvVar4);
        (this_00->buckets)._M_elems[uVar1] = pvVar4;
      }
      vector_brodnik<unsigned_char_*>::push_back(pvVar4,t);
      t = t + 1;
    }
  }
  for (; index < (sVar3 & 0xffffffff); index = index + 1) {
    strings._M_elems[0] = vector_brodnik<unsigned_char_*>::operator[](bucket,index);
    uVar2 = get_char<unsigned_short>(strings._M_elems[0],depth);
    pvVar4 = (vector_brodnik<unsigned_char_*> *)(this_00->buckets)._M_elems[uVar2];
    if (pvVar4 == (vector_brodnik<unsigned_char_*> *)0x0) {
      pvVar4 = (vector_brodnik<unsigned_char_*> *)operator_new(0x38);
      vector_brodnik<unsigned_char_*>::vector_brodnik(pvVar4);
      (this_00->buckets)._M_elems[uVar2] = pvVar4;
    }
    vector_brodnik<unsigned_char_*>::push_back(pvVar4,strings._M_elems);
  }
  return this_00;
}

Assistant:

TrieNode<CharT>*
	operator()(const BucketT& bucket, size_t depth) const
	{
		TrieNode<CharT>* new_node = new TrieNode<CharT>;
		const unsigned bucket_size = bucket.size();
		// Use a small cache to reduce memory stalls. Also cache the
		// string pointers, in case the indexing operation of the
		// container is expensive.
		unsigned i=0;
		for (; i < bucket_size-bucket_size%64; i+=64) {
			array<CharT, 64> cache;
			array<unsigned char*, 64> strings;
			for (unsigned j=0; j < 64; ++j) {
				strings[j] = bucket[i+j];
				cache[j] = get_char<CharT>(strings[j], depth);
			}
			for (unsigned j=0; j < 64; ++j) {
				const CharT ch = cache[j];
				BucketT* sub_bucket = static_cast<BucketT*>(
					new_node->buckets[ch]);
				if (not sub_bucket) {
					new_node->buckets[ch] = sub_bucket
						= new BucketT;
				}
				sub_bucket->push_back(strings[j]);
			}
		}
		for (; i < bucket_size; ++i) {
			unsigned char* ptr = bucket[i];
			const CharT ch = get_char<CharT>(ptr, depth);
			BucketT* sub_bucket = static_cast<BucketT*>(
				new_node->buckets[ch]);
			if (not sub_bucket) {
				new_node->buckets[ch] = sub_bucket
					= new BucketT;
			}
			sub_bucket->push_back(ptr);
		}
		return new_node;
	}